

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.h
# Opt level: O0

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxWeightST(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *old)

{
  long in_RSI;
  DataArray<bool> *in_RDI;
  SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffb8;
  SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffc0;
  DataArray<int> *in_stack_ffffffffffffffc8;
  DataArray<bool> *old_00;
  
  SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxStarter(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__SPxWeightST_0089bdb0;
  DataArray<int>::DataArray((DataArray<int> *)in_RDI,in_stack_ffffffffffffffc8);
  old_00 = in_RDI + 3;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_RDI,
          (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)old_00);
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_RDI,
          (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)old_00);
  DataArray<bool>::DataArray(in_RDI,old_00);
  DataArray<bool>::DataArray(in_RDI,old_00);
  if (*(long *)(in_RSI + 0x38) == in_RSI + 0x60) {
    in_RDI[2].data = (bool *)(in_RDI + 4);
    in_RDI[2].memFactor = (Real)(in_RDI + 3);
  }
  else if (*(long *)(in_RSI + 0x38) == in_RSI + 0x48) {
    in_RDI[2].data = (bool *)(in_RDI + 3);
    in_RDI[2].memFactor = (Real)(in_RDI + 4);
  }
  else {
    in_RDI[2].data = (bool *)0x0;
    in_RDI[2].memFactor = 0.0;
  }
  return;
}

Assistant:

SPxWeightST(const SPxWeightST& old)
      : SPxStarter<R>(old)
      , forbidden(old.forbidden)
      , rowWeight(old.rowWeight)
      , colWeight(old.colWeight)
      , rowRight(old.rowRight)
      , colUp(old.colUp)
   {
      if(old.weight == &old.colWeight)
      {
         weight   = &colWeight;
         coWeight = &rowWeight;
      }
      else if(old.weight == &old.rowWeight)
      {
         weight   = &rowWeight;
         coWeight = &colWeight;
      }
      else  // old.weight and old.coWeight are not set correctly, do nothing.
      {
         weight = nullptr;
         coWeight = nullptr;
      }

      assert(isConsistent());
   }